

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Block * __thiscall
soul::heart::Parser::getBlock(Parser *this,FunctionParseState *state,Identifier name)

{
  BlockCode *b;
  pointer pBVar1;
  Identifier *in_R9;
  string *local_50;
  CompileMessage local_48;
  
  pBVar1 = (state->blocks).
           super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pBVar1 == (state->blocks).
                  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_50 = name.name;
      CompileMessageHelpers::createMessage<soul::Identifier&>
                (&local_48,(CompileMessageHelpers *)0x1,none,0x2a39f6,(char *)&local_50,in_R9);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_48);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
        operator_delete(local_48.description._M_dataplus._M_p,
                        local_48.description.field_2._M_allocated_capacity + 1);
      }
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    if ((pBVar1->block->name).name == name.name) break;
    pBVar1 = pBVar1 + 1;
  }
  return pBVar1->block;
}

Assistant:

heart::Block& getBlock (const FunctionParseState& state, Identifier name)
    {
        auto b = findBlock (state, name);

        if (b == nullptr)
            throwError (Errors::cannotFind (name));

        return *b;
    }